

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int prepareheaderDataInfo(MQTTCODEC_INSTANCE *codecData,uint8_t remainLen)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  BUFFER_HANDLE pBVar5;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  long lStack_28;
  uint8_t encodeByte;
  size_t index;
  int totalLen;
  int multiplier;
  int result;
  uint8_t remainLen_local;
  MQTTCODEC_INSTANCE *codecData_local;
  
  totalLen = 0;
  sVar2 = codecData->remainLenIndex;
  codecData->remainLenIndex = sVar2 + 1;
  codecData->storeRemainLen[sVar2] = remainLen;
  if (remainLen < 0x80) {
    index._4_4_ = 1;
    index._0_4_ = 0;
    lStack_28 = 0;
    do {
      puVar1 = codecData->storeRemainLen + lStack_28;
      index._0_4_ = (*puVar1 & 0x7f) * index._4_4_ + (uint)index;
      index._4_4_ = index._4_4_ << 7;
      if (0x200000 < index._4_4_) {
        totalLen = 0x216;
        break;
      }
      lStack_28 = lStack_28 + 1;
    } while ((*puVar1 & 0x80) != 0);
    if ((totalLen == 0) && ((uint)index < 0xffffff80)) {
      codecData->codecState = CODEC_STATE_VAR_HEADER;
      codecData->remainLenIndex = 0;
      memset(codecData->storeRemainLen,0,4);
      if (0 < (int)(uint)index) {
        codecData->bufferOffset = 0;
        pBVar5 = BUFFER_new();
        codecData->headerData = pBVar5;
        if (codecData->headerData == (BUFFER_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                      ,"prepareheaderDataInfo",0x22f,1,"Failed BUFFER_new");
          }
          totalLen = 0x230;
        }
        else {
          iVar3 = BUFFER_pre_build(codecData->headerData,(long)(int)(uint)index);
          if (iVar3 != 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                        ,"prepareheaderDataInfo",0x237,1,"Failed BUFFER_pre_build");
            }
            totalLen = 0x238;
          }
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                  ,"prepareheaderDataInfo",0x21d,1,"Receive buffer too large for MQTT packet");
      }
      totalLen = 0x21e;
    }
  }
  else if (codecData->remainLenIndex == 4) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                ,"prepareheaderDataInfo",0x246,1,"MQTT packet len is invalid");
    }
    totalLen = 0x247;
  }
  return totalLen;
}

Assistant:

static int prepareheaderDataInfo(MQTTCODEC_INSTANCE* codecData, uint8_t remainLen)
{
    int result;
    result = 0;
    codecData->storeRemainLen[codecData->remainLenIndex++] = remainLen;
    if (remainLen <= 0x7f)
    {
        int multiplier = 1;
        int totalLen = 0;
        size_t index = 0;
        uint8_t encodeByte = 0;
        do
        {
            encodeByte = codecData->storeRemainLen[index++];
            totalLen += (encodeByte & 127) * multiplier;
            multiplier *= NEXT_128_CHUNK;

            if (multiplier > MAX_3_DIGIT_PACKET_SIZE)
            {
                result = MU_FAILURE;
                break;
            }
        } while ((encodeByte & NEXT_128_CHUNK) != 0);

        if (result != 0 || totalLen > MAX_SEND_SIZE)
        {
            LogError("Receive buffer too large for MQTT packet");
            result = MU_FAILURE;
        }
        else
        {
            codecData->codecState = CODEC_STATE_VAR_HEADER;

            // Reset remainLen Index
            codecData->remainLenIndex = 0;
            memset(codecData->storeRemainLen, 0, 4 * sizeof(uint8_t));

            if (totalLen > 0)
            {
                codecData->bufferOffset = 0;
                codecData->headerData = BUFFER_new();
                if (codecData->headerData == NULL)
                {
                    /* Codes_SRS_MQTT_CODEC_07_035: [ If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value. ] */
                    LogError("Failed BUFFER_new");
                    result = MU_FAILURE;
                }
                else
                {
                    if (BUFFER_pre_build(codecData->headerData, totalLen) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [ If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value. ] */
                        LogError("Failed BUFFER_pre_build");
                        result = MU_FAILURE;
                    }

                }
            }
        }
    }
    else if (codecData->remainLenIndex == (sizeof(codecData->storeRemainLen) / sizeof(codecData->storeRemainLen[0])))
    {
        // The maximum number of bytes in the Remaining Length field is four
        // This allows applications to send Control Packets of size up to 268,435,455 (256 MB). 
        // The representation of this number on the wire is: 0xFF, 0xFF, 0xFF, 0x7F.

        // The last byte has exceed the max value of 0x7F
        LogError("MQTT packet len is invalid");
        result = MU_FAILURE;
    }
    return result;
}